

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGen::SubDirPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  cmQtAutoGen *pcVar1;
  cmQtAutoGen *pcVar2;
  size_t sVar3;
  
  sVar3 = filename._M_len;
  if (this == (cmQtAutoGen *)0x0) {
LAB_00520f6b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    do {
      pcVar2 = this + -1;
      if (this == (cmQtAutoGen *)0x0) goto LAB_00520f6b;
      pcVar1 = this + (sVar3 - 1);
      this = pcVar2;
    } while (*pcVar1 != (cmQtAutoGen)0x2f);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar3,pcVar2 + sVar3 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::SubDirPrefix(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos == cm::string_view::npos) {
    return std::string();
  }
  return std::string(filename.substr(0, slashPos + 1));
}